

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

void Json::CharReaderBuilder::setDefaults(Value *settings)

{
  ValueHolder VVar1;
  ValueHolder *pVVar2;
  Value *pVVar3;
  ValueHolder local_1a0;
  ushort local_198;
  ValueHolder local_190;
  ValueHolder VStack_188;
  ValueHolder local_180;
  ValueHolder local_178;
  ushort local_170;
  ValueHolder local_168;
  ValueHolder VStack_160;
  ValueHolder local_158;
  ValueHolder local_150;
  ushort local_148;
  ValueHolder local_140;
  ValueHolder VStack_138;
  ValueHolder local_130;
  ValueHolder local_128;
  ushort local_120;
  CommentInfo *local_118;
  ptrdiff_t pStack_110;
  ptrdiff_t local_108;
  ValueHolder local_100;
  ushort local_f8;
  ValueHolder local_f0;
  ValueHolder VStack_e8;
  ValueHolder local_e0;
  ValueHolder local_d8;
  ushort local_d0;
  ValueHolder local_c8;
  ValueHolder VStack_c0;
  ValueHolder local_b8;
  ValueHolder local_b0;
  ushort local_a8;
  ValueHolder local_a0;
  ValueHolder VStack_98;
  ValueHolder local_90;
  ValueHolder local_88;
  ushort local_80;
  ValueHolder local_78;
  ValueHolder VStack_70;
  ValueHolder local_68;
  ValueHolder local_60;
  ushort local_58;
  ValueHolder local_50;
  ValueHolder VStack_48;
  ValueHolder local_40;
  ValueHolder local_38;
  ushort local_30;
  ValueHolder local_28;
  ValueHolder VStack_20;
  ValueHolder local_18;
  
  local_30 = 5;
  local_28 = (ValueHolder)0x0;
  VStack_20 = (ValueHolder)0x0;
  local_18 = (ValueHolder)0x0;
  local_38.bool_ = true;
  pVVar2 = &Value::resolveReference(settings,"collectComments","")->value_;
  local_30 = *(ushort *)(pVVar2 + 1);
  VVar1 = *pVVar2;
  *pVVar2 = local_38;
  *(ushort *)(pVVar2 + 1) = local_30 & 0xfe00 | 5;
  local_30 = local_30 & 0x1ff;
  local_28 = pVVar2[2];
  pVVar2[2].int_ = 0;
  VStack_20 = pVVar2[3];
  local_18 = pVVar2[4];
  pVVar2[3].int_ = 0;
  pVVar2[4].int_ = 0;
  local_38 = VVar1;
  Value::~Value((Value *)&local_38);
  local_58 = 5;
  local_50 = (ValueHolder)0x0;
  VStack_48 = (ValueHolder)0x0;
  local_40 = (ValueHolder)0x0;
  local_60.bool_ = true;
  pVVar2 = &Value::resolveReference(settings,"allowComments","")->value_;
  local_58 = *(ushort *)(pVVar2 + 1);
  VVar1 = *pVVar2;
  *pVVar2 = local_60;
  *(ushort *)(pVVar2 + 1) = local_58 & 0xfe00 | 5;
  local_58 = local_58 & 0x1ff;
  local_50 = pVVar2[2];
  pVVar2[2].int_ = 0;
  VStack_48 = pVVar2[3];
  local_40 = pVVar2[4];
  pVVar2[3].int_ = 0;
  pVVar2[4].int_ = 0;
  local_60 = VVar1;
  Value::~Value((Value *)&local_60);
  local_80 = 5;
  local_78 = (ValueHolder)0x0;
  VStack_70 = (ValueHolder)0x0;
  local_68 = (ValueHolder)0x0;
  local_88.uint_ = local_88.uint_ & 0xffffffffffffff00;
  pVVar2 = &Value::resolveReference(settings,"strictRoot","")->value_;
  local_80 = *(ushort *)(pVVar2 + 1);
  VVar1.uint_ = *(LargestUInt *)pVVar2;
  pVVar2->uint_ = (LargestUInt)local_88;
  *(ushort *)(pVVar2 + 1) = local_80 & 0xfe00 | 5;
  local_80 = local_80 & 0x1ff;
  local_78 = pVVar2[2];
  pVVar2[2].int_ = 0;
  VStack_70 = pVVar2[3];
  local_68 = pVVar2[4];
  pVVar2[3].int_ = 0;
  pVVar2[4].int_ = 0;
  local_88.uint_ = VVar1.uint_;
  Value::~Value((Value *)&local_88);
  local_a8 = 5;
  local_a0 = (ValueHolder)0x0;
  VStack_98 = (ValueHolder)0x0;
  local_90 = (ValueHolder)0x0;
  local_b0.uint_ = local_b0.uint_ & 0xffffffffffffff00;
  pVVar2 = &Value::resolveReference(settings,"allowDroppedNullPlaceholders","")->value_;
  local_a8 = *(ushort *)(pVVar2 + 1);
  VVar1.uint_ = *(LargestUInt *)pVVar2;
  pVVar2->uint_ = (LargestUInt)local_b0;
  *(ushort *)(pVVar2 + 1) = local_a8 & 0xfe00 | 5;
  local_a8 = local_a8 & 0x1ff;
  local_a0 = pVVar2[2];
  pVVar2[2].int_ = 0;
  VStack_98 = pVVar2[3];
  local_90 = pVVar2[4];
  pVVar2[3].int_ = 0;
  pVVar2[4].int_ = 0;
  local_b0.uint_ = VVar1.uint_;
  Value::~Value((Value *)&local_b0);
  local_d0 = 5;
  local_c8 = (ValueHolder)0x0;
  VStack_c0 = (ValueHolder)0x0;
  local_b8 = (ValueHolder)0x0;
  local_d8.uint_ = local_d8.uint_ & 0xffffffffffffff00;
  pVVar2 = &Value::resolveReference(settings,"allowNumericKeys","")->value_;
  local_d0 = *(ushort *)(pVVar2 + 1);
  VVar1.uint_ = *(LargestUInt *)pVVar2;
  pVVar2->uint_ = (LargestUInt)local_d8;
  *(ushort *)(pVVar2 + 1) = local_d0 & 0xfe00 | 5;
  local_d0 = local_d0 & 0x1ff;
  local_c8 = pVVar2[2];
  pVVar2[2].int_ = 0;
  VStack_c0 = pVVar2[3];
  local_b8 = pVVar2[4];
  pVVar2[3].int_ = 0;
  pVVar2[4].int_ = 0;
  local_d8.uint_ = VVar1.uint_;
  Value::~Value((Value *)&local_d8);
  local_f8 = 5;
  local_f0 = (ValueHolder)0x0;
  VStack_e8 = (ValueHolder)0x0;
  local_e0 = (ValueHolder)0x0;
  local_100.uint_ = local_100.uint_ & 0xffffffffffffff00;
  pVVar2 = &Value::resolveReference(settings,"allowSingleQuotes","")->value_;
  local_f8 = *(ushort *)(pVVar2 + 1);
  VVar1.uint_ = *(LargestUInt *)pVVar2;
  pVVar2->uint_ = (LargestUInt)local_100;
  *(ushort *)(pVVar2 + 1) = local_f8 & 0xfe00 | 5;
  local_f8 = local_f8 & 0x1ff;
  local_f0 = pVVar2[2];
  pVVar2[2].int_ = 0;
  VStack_e8 = pVVar2[3];
  local_e0 = pVVar2[4];
  pVVar2[3].int_ = 0;
  pVVar2[4].int_ = 0;
  local_100.uint_ = VVar1.uint_;
  Value::~Value((Value *)&local_100);
  local_120 = 1;
  local_118 = (CommentInfo *)0x0;
  pStack_110 = 0;
  local_108 = 0;
  local_128.int_ = 1000;
  pVVar3 = Value::resolveReference(settings,"stackLimit","");
  local_120 = *(ushort *)&pVVar3->field_0x8;
  local_128.int_ = *(LargestInt *)&pVVar3->value_;
  (pVVar3->value_).int_ = 1000;
  *(ushort *)&pVVar3->field_0x8 = (local_120 & 0xfe00) + 1;
  local_120 = local_120 & 0x1ff;
  local_118 = pVVar3->comments_;
  pVVar3->comments_ = (CommentInfo *)0x0;
  pStack_110 = pVVar3->start_;
  local_108 = pVVar3->limit_;
  pVVar3->start_ = 0;
  pVVar3->limit_ = 0;
  Value::~Value((Value *)&local_128);
  local_148 = 5;
  local_140 = (ValueHolder)0x0;
  VStack_138 = (ValueHolder)0x0;
  local_130 = (ValueHolder)0x0;
  local_150.uint_ = local_150.uint_ & 0xffffffffffffff00;
  pVVar2 = &Value::resolveReference(settings,"failIfExtra","")->value_;
  local_148 = *(ushort *)(pVVar2 + 1);
  VVar1.uint_ = *(LargestUInt *)pVVar2;
  pVVar2->uint_ = (LargestUInt)local_150;
  *(ushort *)(pVVar2 + 1) = local_148 & 0xfe00 | 5;
  local_148 = local_148 & 0x1ff;
  local_140 = pVVar2[2];
  pVVar2[2].int_ = 0;
  VStack_138 = pVVar2[3];
  local_130 = pVVar2[4];
  pVVar2[3].int_ = 0;
  pVVar2[4].int_ = 0;
  local_150.uint_ = VVar1.uint_;
  Value::~Value((Value *)&local_150);
  local_170 = 5;
  local_168 = (ValueHolder)0x0;
  VStack_160 = (ValueHolder)0x0;
  local_158 = (ValueHolder)0x0;
  local_178.uint_ = local_178.uint_ & 0xffffffffffffff00;
  pVVar2 = &Value::resolveReference(settings,"rejectDupKeys","")->value_;
  local_170 = *(ushort *)(pVVar2 + 1);
  VVar1.uint_ = *(LargestUInt *)pVVar2;
  pVVar2->uint_ = (LargestUInt)local_178;
  *(ushort *)(pVVar2 + 1) = local_170 & 0xfe00 | 5;
  local_170 = local_170 & 0x1ff;
  local_168 = pVVar2[2];
  pVVar2[2].int_ = 0;
  VStack_160 = pVVar2[3];
  local_158 = pVVar2[4];
  pVVar2[3].int_ = 0;
  pVVar2[4].int_ = 0;
  local_178.uint_ = VVar1.uint_;
  Value::~Value((Value *)&local_178);
  local_198 = 5;
  local_190 = (ValueHolder)0x0;
  VStack_188 = (ValueHolder)0x0;
  local_180 = (ValueHolder)0x0;
  local_1a0.uint_ = local_1a0.uint_ & 0xffffffffffffff00;
  pVVar2 = &Value::resolveReference(settings,"allowSpecialFloats","")->value_;
  local_198 = *(ushort *)(pVVar2 + 1);
  VVar1.uint_ = *(LargestUInt *)pVVar2;
  pVVar2->uint_ = (LargestUInt)local_1a0;
  *(ushort *)(pVVar2 + 1) = local_198 & 0xfe00 | 5;
  local_198 = local_198 & 0x1ff;
  local_190 = pVVar2[2];
  pVVar2[2].int_ = 0;
  VStack_188 = pVVar2[3];
  local_180 = pVVar2[4];
  pVVar2[3].int_ = 0;
  pVVar2[4].int_ = 0;
  local_1a0.uint_ = VVar1.uint_;
  Value::~Value((Value *)&local_1a0);
  return;
}

Assistant:

void CharReaderBuilder::setDefaults(Json::Value* settings)
{
//! [CharReaderBuilderDefaults]
  (*settings)["collectComments"] = true;
  (*settings)["allowComments"] = true;
  (*settings)["strictRoot"] = false;
  (*settings)["allowDroppedNullPlaceholders"] = false;
  (*settings)["allowNumericKeys"] = false;
  (*settings)["allowSingleQuotes"] = false;
  (*settings)["stackLimit"] = 1000;
  (*settings)["failIfExtra"] = false;
  (*settings)["rejectDupKeys"] = false;
  (*settings)["allowSpecialFloats"] = false;
//! [CharReaderBuilderDefaults]
}